

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render-data.cc
# Opt level: O0

bool tinyusdz::tydra::anon_unknown_0::ComputeTangentsAndBinormals
               (vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *vertices,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *faceVertexCounts,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *faceVertexIndices,
               vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *texcoords,
               vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *normals,
               bool is_facevarying_input,
               vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *tangents,
               vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *binormals,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *out_vertex_indices,string *err)

{
  pointer *this;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  value_type_conflict vVar8;
  pointer puVar9;
  bool bVar10;
  uint uVar11;
  uint uVar12;
  ostream *poVar13;
  size_type sVar14;
  size_type sVar15;
  const_iterator __first;
  const_iterator __last;
  reference puVar16;
  ulong uVar17;
  reference pvVar18;
  const_reference pvVar19;
  size_type __n;
  size_type sVar20;
  const_reference pvVar21;
  reference pvVar22;
  const_reference pvVar23;
  reference pvVar24;
  float *pfVar25;
  pointer puVar26;
  iterator __first_00;
  reference puVar27;
  reference pvVar28;
  const_reference pvVar29;
  float *pfVar30;
  reference pvVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  normal3f nVar39;
  uint local_2164;
  uint local_214c;
  undefined8 local_20f0;
  float local_20e8;
  normal3f local_20d0;
  normal3f local_20bc;
  normal3f local_20b0;
  undefined8 local_209c;
  float local_2094;
  normal3f local_2090;
  normal3f local_2080;
  normal3f local_2070;
  undefined8 local_2064;
  float local_205c;
  undefined1 local_2058 [8];
  normal3f Bn_1;
  undefined4 uStack_2044;
  normal3f Tn_1;
  normal3f n;
  size_t i_5;
  float local_2020;
  value_type local_201c;
  normal3f local_2010;
  undefined8 local_1ffc;
  float local_1ff4;
  normal3f local_1ff0;
  undefined8 local_1fdc;
  float local_1fd4;
  ulong local_1fd0;
  size_t i_4;
  normal3f Bn;
  normal3f Tn;
  size_t i_3;
  undefined4 local_1fa0;
  undefined4 local_1f9c;
  undefined1 local_1f98 [8];
  vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_> v_bn;
  undefined1 local_1f70 [8];
  vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_> v_tn;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_1f48;
  uint local_1f3c;
  undefined1 local_1f38 [4];
  uint32_t num_verts;
  vector<unsigned_int,_std::allocator<unsigned_int>_> vertex_point_indices;
  size_t i_2;
  size_t i_1;
  ComputeTangentVertexOutput<tinyusdz::tydra::(anonymous_namespace)::ComputeTangentPackedVertexData>
  vertex_output;
  ComputeTangentVertexInput<tinyusdz::tydra::(anonymous_namespace)::ComputeTangentPackedVertexData>
  vertex_input;
  vector<unsigned_int,_std::allocator<unsigned_int>_> vertex_indices;
  vec3 bdir;
  vec3 tdir;
  float r;
  float t2;
  float t1;
  float s2;
  float s1;
  float z2;
  float z1;
  float y2;
  float y1;
  float x2;
  float x1;
  vec2 uv3;
  vec2 uv2;
  vec2 uv1;
  ostringstream local_1de8 [8];
  ostringstream ss_e_17;
  float w3y;
  float w3x;
  float w2y;
  float w2x;
  float w1y;
  float w1x;
  float v3z;
  float v3y;
  float v3x;
  float v2z;
  float v2y;
  float v2x;
  float v1z;
  float v1y;
  float v1x;
  vec3 v3;
  vec3 v2;
  vec3 v1;
  ostringstream local_1bf0 [8];
  ostringstream ss_e_16;
  uint32_t vf2;
  uint32_t vf1;
  uint32_t vf0;
  size_t fid2;
  size_t fid1;
  size_t fid0;
  size_t f;
  ostringstream local_1a28 [8];
  ostringstream ss_e_15;
  string local_18a8 [32];
  ostringstream local_1888 [8];
  ostringstream ss_e_14;
  size_t nv;
  size_t i;
  size_t faceVertexIndexOffset;
  undefined1 local_16f0 [8];
  vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_> bn;
  undefined1 local_16d0 [8];
  vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_> tn;
  ostringstream local_1698 [8];
  ostringstream ss_e_13;
  string local_1518 [7];
  bool hasFaceVertexCounts;
  ostringstream local_14f8 [8];
  ostringstream ss_e_12;
  string local_1380 [32];
  ostringstream local_1360 [8];
  ostringstream ss_e_11;
  string local_11e8 [32];
  ostringstream local_11c8 [8];
  ostringstream ss_e_10;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_1040;
  uint local_1034;
  string local_1030 [4];
  uint32_t max_vert_index;
  ostringstream local_1010 [8];
  ostringstream ss_e_9;
  string local_e98 [32];
  ostringstream local_e78 [8];
  ostringstream ss_e_8;
  string local_d00 [32];
  ostringstream local_ce0 [8];
  ostringstream ss_e_7;
  string local_b68 [32];
  ostringstream local_b48 [8];
  ostringstream ss_e_6;
  string local_9d0 [32];
  ostringstream local_9b0 [8];
  ostringstream ss_e_5;
  string local_838 [32];
  ostringstream local_818 [8];
  ostringstream ss_e_4;
  string local_6a0 [32];
  ostringstream local_680 [8];
  ostringstream ss_e_3;
  string local_508 [32];
  ostringstream local_4e8 [8];
  ostringstream ss_e_2;
  string local_370 [32];
  ostringstream local_350 [8];
  ostringstream ss_e_1;
  string local_1d8 [32];
  ostringstream local_1b8 [8];
  ostringstream ss_e;
  bool is_facevarying_input_local;
  vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *normals_local;
  vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *texcoords_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *faceVertexIndices_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *faceVertexCounts_local;
  vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *vertices_local;
  
  if (tangents == (vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)0x0) {
    ::std::__cxx11::ostringstream::ostringstream(local_1b8);
    poVar13 = ::std::operator<<((ostream *)local_1b8,"[error]");
    poVar13 = ::std::operator<<(poVar13,
                                "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                               );
    poVar13 = ::std::operator<<(poVar13,":");
    poVar13 = ::std::operator<<(poVar13,"ComputeTangentsAndBinormals");
    poVar13 = ::std::operator<<(poVar13,"():");
    poVar13 = (ostream *)::std::ostream::operator<<(poVar13,0x74f);
    ::std::operator<<(poVar13," ");
    poVar13 = ::std::operator<<((ostream *)local_1b8,"tangents arg is nullptr.");
    ::std::operator<<(poVar13,"\n");
    if (err != (string *)0x0) {
      ::std::__cxx11::ostringstream::str();
      ::std::__cxx11::string::operator+=((string *)err,local_1d8);
      ::std::__cxx11::string::~string(local_1d8);
    }
    vertices_local._7_1_ = false;
    ::std::__cxx11::ostringstream::~ostringstream(local_1b8);
  }
  else if (binormals ==
           (vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)0x0) {
    ::std::__cxx11::ostringstream::ostringstream(local_350);
    poVar13 = ::std::operator<<((ostream *)local_350,"[error]");
    poVar13 = ::std::operator<<(poVar13,
                                "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                               );
    poVar13 = ::std::operator<<(poVar13,":");
    poVar13 = ::std::operator<<(poVar13,"ComputeTangentsAndBinormals");
    poVar13 = ::std::operator<<(poVar13,"():");
    poVar13 = (ostream *)::std::ostream::operator<<(poVar13,0x753);
    ::std::operator<<(poVar13," ");
    poVar13 = ::std::operator<<((ostream *)local_350,"binormals arg is nullptr.");
    ::std::operator<<(poVar13,"\n");
    if (err != (string *)0x0) {
      ::std::__cxx11::ostringstream::str();
      ::std::__cxx11::string::operator+=((string *)err,local_370);
      ::std::__cxx11::string::~string(local_370);
    }
    vertices_local._7_1_ = false;
    ::std::__cxx11::ostringstream::~ostringstream(local_350);
  }
  else if (out_vertex_indices == (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    ::std::__cxx11::ostringstream::ostringstream(local_4e8);
    poVar13 = ::std::operator<<((ostream *)local_4e8,"[error]");
    poVar13 = ::std::operator<<(poVar13,
                                "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                               );
    poVar13 = ::std::operator<<(poVar13,":");
    poVar13 = ::std::operator<<(poVar13,"ComputeTangentsAndBinormals");
    poVar13 = ::std::operator<<(poVar13,"():");
    poVar13 = (ostream *)::std::ostream::operator<<(poVar13,0x757);
    ::std::operator<<(poVar13," ");
    poVar13 = ::std::operator<<((ostream *)local_4e8,"out_indices arg is nullptr.");
    ::std::operator<<(poVar13,"\n");
    if (err != (string *)0x0) {
      ::std::__cxx11::ostringstream::str();
      ::std::__cxx11::string::operator+=((string *)err,local_508);
      ::std::__cxx11::string::~string(local_508);
    }
    vertices_local._7_1_ = false;
    ::std::__cxx11::ostringstream::~ostringstream(local_4e8);
  }
  else {
    bVar10 = ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::empty
                       (vertices);
    if (bVar10) {
      ::std::__cxx11::ostringstream::ostringstream(local_680);
      poVar13 = ::std::operator<<((ostream *)local_680,"[error]");
      poVar13 = ::std::operator<<(poVar13,
                                  "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                 );
      poVar13 = ::std::operator<<(poVar13,":");
      poVar13 = ::std::operator<<(poVar13,"ComputeTangentsAndBinormals");
      poVar13 = ::std::operator<<(poVar13,"():");
      poVar13 = (ostream *)::std::ostream::operator<<(poVar13,0x75b);
      ::std::operator<<(poVar13," ");
      poVar13 = ::std::operator<<((ostream *)local_680,"vertices is empty.");
      ::std::operator<<(poVar13,"\n");
      if (err != (string *)0x0) {
        ::std::__cxx11::ostringstream::str();
        ::std::__cxx11::string::operator+=((string *)err,local_6a0);
        ::std::__cxx11::string::~string(local_6a0);
      }
      vertices_local._7_1_ = false;
      ::std::__cxx11::ostringstream::~ostringstream(local_680);
    }
    else {
      sVar14 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(faceVertexIndices);
      if (sVar14 < 3) {
        ::std::__cxx11::ostringstream::ostringstream(local_818);
        poVar13 = ::std::operator<<((ostream *)local_818,"[error]");
        poVar13 = ::std::operator<<(poVar13,
                                    "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                   );
        poVar13 = ::std::operator<<(poVar13,":");
        poVar13 = ::std::operator<<(poVar13,"ComputeTangentsAndBinormals");
        poVar13 = ::std::operator<<(poVar13,"():");
        poVar13 = (ostream *)::std::ostream::operator<<(poVar13,0x760);
        ::std::operator<<(poVar13," ");
        poVar13 = ::std::operator<<((ostream *)local_818,"faceVertexIndices.size < 3");
        ::std::operator<<(poVar13,"\n");
        if (err != (string *)0x0) {
          ::std::__cxx11::ostringstream::str();
          ::std::__cxx11::string::operator+=((string *)err,local_838);
          ::std::__cxx11::string::~string(local_838);
        }
        vertices_local._7_1_ = false;
        ::std::__cxx11::ostringstream::~ostringstream(local_818);
      }
      else {
        bVar10 = ::std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>::
                 empty(texcoords);
        if (bVar10) {
          ::std::__cxx11::ostringstream::ostringstream(local_9b0);
          poVar13 = ::std::operator<<((ostream *)local_9b0,"[error]");
          poVar13 = ::std::operator<<(poVar13,
                                      "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                     );
          poVar13 = ::std::operator<<(poVar13,":");
          poVar13 = ::std::operator<<(poVar13,"ComputeTangentsAndBinormals");
          poVar13 = ::std::operator<<(poVar13,"():");
          poVar13 = (ostream *)::std::ostream::operator<<(poVar13,0x764);
          ::std::operator<<(poVar13," ");
          poVar13 = ::std::operator<<((ostream *)local_9b0,"texcoords is empty");
          ::std::operator<<(poVar13,"\n");
          if (err != (string *)0x0) {
            ::std::__cxx11::ostringstream::str();
            ::std::__cxx11::string::operator+=((string *)err,local_9d0);
            ::std::__cxx11::string::~string(local_9d0);
          }
          vertices_local._7_1_ = false;
          ::std::__cxx11::ostringstream::~ostringstream(local_9b0);
        }
        else {
          bVar10 = ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::
                   empty(normals);
          if (bVar10) {
            ::std::__cxx11::ostringstream::ostringstream(local_b48);
            poVar13 = ::std::operator<<((ostream *)local_b48,"[error]");
            poVar13 = ::std::operator<<(poVar13,
                                        "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                       );
            poVar13 = ::std::operator<<(poVar13,":");
            poVar13 = ::std::operator<<(poVar13,"ComputeTangentsAndBinormals");
            poVar13 = ::std::operator<<(poVar13,"():");
            poVar13 = (ostream *)::std::ostream::operator<<(poVar13,0x768);
            ::std::operator<<(poVar13," ");
            poVar13 = ::std::operator<<((ostream *)local_b48,"normals is empty");
            ::std::operator<<(poVar13,"\n");
            if (err != (string *)0x0) {
              ::std::__cxx11::ostringstream::str();
              ::std::__cxx11::string::operator+=((string *)err,local_b68);
              ::std::__cxx11::string::~string(local_b68);
            }
            vertices_local._7_1_ = false;
            ::std::__cxx11::ostringstream::~ostringstream(local_b48);
          }
          else {
            if (is_facevarying_input) {
              sVar14 = ::std::
                       vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::
                       size(vertices);
              sVar15 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                                 (faceVertexIndices);
              if (sVar14 != sVar15) {
                ::std::__cxx11::ostringstream::ostringstream(local_ce0);
                poVar13 = ::std::operator<<((ostream *)local_ce0,"[error]");
                poVar13 = ::std::operator<<(poVar13,
                                            "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                           );
                poVar13 = ::std::operator<<(poVar13,":");
                poVar13 = ::std::operator<<(poVar13,"ComputeTangentsAndBinormals");
                poVar13 = ::std::operator<<(poVar13,"():");
                poVar13 = (ostream *)::std::ostream::operator<<(poVar13,0x76d);
                ::std::operator<<(poVar13," ");
                poVar13 = ::std::operator<<((ostream *)local_ce0,"Invalid vertices.size.");
                ::std::operator<<(poVar13,"\n");
                if (err != (string *)0x0) {
                  ::std::__cxx11::ostringstream::str();
                  ::std::__cxx11::string::operator+=((string *)err,local_d00);
                  ::std::__cxx11::string::~string(local_d00);
                }
                ::std::__cxx11::ostringstream::~ostringstream(local_ce0);
                return false;
              }
              sVar14 = ::std::
                       vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>::
                       size(texcoords);
              sVar15 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                                 (faceVertexIndices);
              if (sVar14 != sVar15) {
                ::std::__cxx11::ostringstream::ostringstream(local_e78);
                poVar13 = ::std::operator<<((ostream *)local_e78,"[error]");
                poVar13 = ::std::operator<<(poVar13,
                                            "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                           );
                poVar13 = ::std::operator<<(poVar13,":");
                poVar13 = ::std::operator<<(poVar13,"ComputeTangentsAndBinormals");
                poVar13 = ::std::operator<<(poVar13,"():");
                poVar13 = (ostream *)::std::ostream::operator<<(poVar13,0x770);
                ::std::operator<<(poVar13," ");
                poVar13 = ::std::operator<<((ostream *)local_e78,"Invalid texcoords.size.");
                ::std::operator<<(poVar13,"\n");
                if (err != (string *)0x0) {
                  ::std::__cxx11::ostringstream::str();
                  ::std::__cxx11::string::operator+=((string *)err,local_e98);
                  ::std::__cxx11::string::~string(local_e98);
                }
                ::std::__cxx11::ostringstream::~ostringstream(local_e78);
                return false;
              }
              sVar14 = ::std::
                       vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::
                       size(normals);
              sVar15 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                                 (faceVertexIndices);
              if (sVar14 != sVar15) {
                ::std::__cxx11::ostringstream::ostringstream(local_1010);
                poVar13 = ::std::operator<<((ostream *)local_1010,"[error]");
                poVar13 = ::std::operator<<(poVar13,
                                            "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                           );
                poVar13 = ::std::operator<<(poVar13,":");
                poVar13 = ::std::operator<<(poVar13,"ComputeTangentsAndBinormals");
                poVar13 = ::std::operator<<(poVar13,"():");
                poVar13 = (ostream *)::std::ostream::operator<<(poVar13,0x773);
                ::std::operator<<(poVar13," ");
                poVar13 = ::std::operator<<((ostream *)local_1010,"Invalid normals.size.");
                ::std::operator<<(poVar13,"\n");
                if (err != (string *)0x0) {
                  ::std::__cxx11::ostringstream::str();
                  ::std::__cxx11::string::operator+=((string *)err,local_1030);
                  ::std::__cxx11::string::~string(local_1030);
                }
                ::std::__cxx11::ostringstream::~ostringstream(local_1010);
                return false;
              }
            }
            else {
              __first = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                                  (faceVertexIndices);
              __last = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                                 (faceVertexIndices);
              local_1040 = ::std::
                           max_element<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                                     (__first._M_current,__last._M_current);
              puVar16 = __gnu_cxx::
                        __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        ::operator*(&local_1040);
              local_1034 = *puVar16;
              uVar17 = (ulong)local_1034;
              sVar14 = ::std::
                       vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::
                       size(vertices);
              if (sVar14 <= uVar17) {
                ::std::__cxx11::ostringstream::ostringstream(local_11c8);
                poVar13 = ::std::operator<<((ostream *)local_11c8,"[error]");
                poVar13 = ::std::operator<<(poVar13,
                                            "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                           );
                poVar13 = ::std::operator<<(poVar13,":");
                poVar13 = ::std::operator<<(poVar13,"ComputeTangentsAndBinormals");
                poVar13 = ::std::operator<<(poVar13,"():");
                poVar13 = (ostream *)::std::ostream::operator<<(poVar13,0x779);
                ::std::operator<<(poVar13," ");
                poVar13 = ::std::operator<<((ostream *)local_11c8,"Invalid vertices.size.");
                ::std::operator<<(poVar13,"\n");
                if (err != (string *)0x0) {
                  ::std::__cxx11::ostringstream::str();
                  ::std::__cxx11::string::operator+=((string *)err,local_11e8);
                  ::std::__cxx11::string::~string(local_11e8);
                }
                ::std::__cxx11::ostringstream::~ostringstream(local_11c8);
                return false;
              }
              uVar17 = (ulong)local_1034;
              sVar14 = ::std::
                       vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>::
                       size(texcoords);
              if (sVar14 <= uVar17) {
                ::std::__cxx11::ostringstream::ostringstream(local_1360);
                poVar13 = ::std::operator<<((ostream *)local_1360,"[error]");
                poVar13 = ::std::operator<<(poVar13,
                                            "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                           );
                poVar13 = ::std::operator<<(poVar13,":");
                poVar13 = ::std::operator<<(poVar13,"ComputeTangentsAndBinormals");
                poVar13 = ::std::operator<<(poVar13,"():");
                poVar13 = (ostream *)::std::ostream::operator<<(poVar13,0x77c);
                ::std::operator<<(poVar13," ");
                poVar13 = ::std::operator<<((ostream *)local_1360,"Invalid texcoords.size.");
                ::std::operator<<(poVar13,"\n");
                if (err != (string *)0x0) {
                  ::std::__cxx11::ostringstream::str();
                  ::std::__cxx11::string::operator+=((string *)err,local_1380);
                  ::std::__cxx11::string::~string(local_1380);
                }
                ::std::__cxx11::ostringstream::~ostringstream(local_1360);
                return false;
              }
              uVar17 = (ulong)local_1034;
              sVar14 = ::std::
                       vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::
                       size(normals);
              if (sVar14 <= uVar17) {
                ::std::__cxx11::ostringstream::ostringstream(local_14f8);
                poVar13 = ::std::operator<<((ostream *)local_14f8,"[error]");
                poVar13 = ::std::operator<<(poVar13,
                                            "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                           );
                poVar13 = ::std::operator<<(poVar13,":");
                poVar13 = ::std::operator<<(poVar13,"ComputeTangentsAndBinormals");
                poVar13 = ::std::operator<<(poVar13,"():");
                poVar13 = (ostream *)::std::ostream::operator<<(poVar13,0x77f);
                ::std::operator<<(poVar13," ");
                poVar13 = ::std::operator<<((ostream *)local_14f8,"Invalid normals.size.");
                ::std::operator<<(poVar13,"\n");
                if (err != (string *)0x0) {
                  ::std::__cxx11::ostringstream::str();
                  ::std::__cxx11::string::operator+=((string *)err,local_1518);
                  ::std::__cxx11::string::~string(local_1518);
                }
                ::std::__cxx11::ostringstream::~ostringstream(local_14f8);
                return false;
              }
            }
            bVar10 = true;
            sVar14 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                               (faceVertexCounts);
            if (sVar14 == 0) {
              sVar14 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                                 (faceVertexIndices);
              if (sVar14 % 3 != 0) {
                ::std::__cxx11::ostringstream::ostringstream(local_1698);
                poVar13 = ::std::operator<<((ostream *)local_1698,"[error]");
                poVar13 = ::std::operator<<(poVar13,
                                            "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                           );
                poVar13 = ::std::operator<<(poVar13,":");
                poVar13 = ::std::operator<<(poVar13,"ComputeTangentsAndBinormals");
                poVar13 = ::std::operator<<(poVar13,"():");
                poVar13 = (ostream *)::std::ostream::operator<<(poVar13,0x789);
                ::std::operator<<(poVar13," ");
                poVar13 = ::std::operator<<((ostream *)local_1698,
                                            "Invalid faceVertexIndices. It must be all triangles: faceVertexIndices.size % 3 == 0"
                                           );
                ::std::operator<<(poVar13,"\n");
                if (err != (string *)0x0) {
                  ::std::__cxx11::ostringstream::str();
                  ::std::__cxx11::string::operator+=
                            ((string *)err,
                             (string *)
                             &tn.
                              super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
                  ::std::__cxx11::string::~string
                            ((string *)
                             &tn.
                              super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
                }
                ::std::__cxx11::ostringstream::~ostringstream(local_1698);
                return false;
              }
              bVar10 = false;
            }
            sVar14 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                               (faceVertexIndices);
            ::std::allocator<tinyusdz::value::normal3f>::allocator
                      ((allocator<tinyusdz::value::normal3f> *)
                       ((long)&bn.
                               super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
            ::std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>::
            vector((vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_> *)
                   local_16d0,sVar14,
                   (allocator_type *)
                   ((long)&bn.
                           super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
            ::std::allocator<tinyusdz::value::normal3f>::~allocator
                      ((allocator<tinyusdz::value::normal3f> *)
                       ((long)&bn.
                               super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
            pvVar18 = ::std::
                      vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                      ::at((vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                            *)local_16d0,0);
            sVar14 = ::std::
                     vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>::
                     size((vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                           *)local_16d0);
            memset(pvVar18,0,sVar14 * 0xc);
            sVar14 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                               (faceVertexIndices);
            ::std::allocator<tinyusdz::value::normal3f>::allocator
                      ((allocator<tinyusdz::value::normal3f> *)((long)&faceVertexIndexOffset + 7));
            ::std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>::
            vector((vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_> *)
                   local_16f0,sVar14,(allocator_type *)((long)&faceVertexIndexOffset + 7));
            ::std::allocator<tinyusdz::value::normal3f>::~allocator
                      ((allocator<tinyusdz::value::normal3f> *)((long)&faceVertexIndexOffset + 7));
            pvVar18 = ::std::
                      vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                      ::at((vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                            *)local_16f0,0);
            sVar14 = ::std::
                     vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>::
                     size((vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                           *)local_16f0);
            memset(pvVar18,0,sVar14 * 0xc);
            i = 0;
            for (nv = 0; sVar14 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                                            (faceVertexCounts), nv < sVar14; nv = nv + 1) {
              if (bVar10) {
                pvVar19 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                    (faceVertexCounts,nv);
                local_214c = *pvVar19;
              }
              else {
                local_214c = 3;
              }
              uVar17 = (ulong)local_214c;
              sVar14 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                                 (faceVertexIndices);
              if (sVar14 <= i + uVar17) {
                ::std::__cxx11::ostringstream::ostringstream(local_1888);
                poVar13 = ::std::operator<<((ostream *)local_1888,"[error]");
                poVar13 = ::std::operator<<(poVar13,
                                            "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                           );
                poVar13 = ::std::operator<<(poVar13,":");
                poVar13 = ::std::operator<<(poVar13,"ComputeTangentsAndBinormals");
                poVar13 = ::std::operator<<(poVar13,"():");
                poVar13 = (ostream *)::std::ostream::operator<<(poVar13,0x79d);
                ::std::operator<<(poVar13," ");
                poVar13 = ::std::operator<<((ostream *)local_1888,
                                            "Invalid value in faceVertexOffset.");
                ::std::operator<<(poVar13,"\n");
                if (err != (string *)0x0) {
                  ::std::__cxx11::ostringstream::str();
                  ::std::__cxx11::string::operator+=((string *)err,local_18a8);
                  ::std::__cxx11::string::~string(local_18a8);
                }
                vertices_local._7_1_ = false;
                ::std::__cxx11::ostringstream::~ostringstream(local_1888);
                goto LAB_004bec86;
              }
              if (uVar17 < 3) {
                ::std::__cxx11::ostringstream::ostringstream(local_1a28);
                poVar13 = ::std::operator<<((ostream *)local_1a28,"[error]");
                poVar13 = ::std::operator<<(poVar13,
                                            "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                           );
                poVar13 = ::std::operator<<(poVar13,":");
                poVar13 = ::std::operator<<(poVar13,"ComputeTangentsAndBinormals");
                poVar13 = ::std::operator<<(poVar13,"():");
                poVar13 = (ostream *)::std::ostream::operator<<(poVar13,0x7a1);
                ::std::operator<<(poVar13," ");
                poVar13 = ::std::operator<<((ostream *)local_1a28,"Degenerated facet found.");
                ::std::operator<<(poVar13,"\n");
                if (err != (string *)0x0) {
                  ::std::__cxx11::ostringstream::str();
                  ::std::__cxx11::string::operator+=((string *)err,(string *)&f);
                  ::std::__cxx11::string::~string((string *)&f);
                }
                vertices_local._7_1_ = false;
                ::std::__cxx11::ostringstream::~ostringstream(local_1a28);
                goto LAB_004bec86;
              }
              for (fid0 = 0; fid0 < uVar17 - 2; fid0 = fid0 + 1) {
                sVar14 = i + fid0;
                sVar15 = i + fid0 + 1;
                __n = i + fid0 + 2;
                if (is_facevarying_input) {
                  uVar11 = (uint)sVar14;
                  uVar12 = (uint)sVar15;
                  local_2164 = (uint)__n;
                }
                else {
                  pvVar19 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                      (faceVertexIndices,sVar14);
                  uVar11 = *pvVar19;
                  pvVar19 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                      (faceVertexIndices,sVar15);
                  uVar12 = *pvVar19;
                  pvVar19 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                      (faceVertexIndices,__n);
                  local_2164 = *pvVar19;
                }
                sVar20 = ::std::
                         vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::
                         size(vertices);
                if (((sVar20 <= uVar11) ||
                    (sVar20 = ::std::
                              vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                              ::size(vertices), sVar20 <= uVar12)) ||
                   (sVar20 = ::std::
                             vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                             ::size(vertices), sVar20 <= local_2164)) {
                  ::std::__cxx11::ostringstream::ostringstream(local_1bf0);
                  poVar13 = ::std::operator<<((ostream *)local_1bf0,"[error]");
                  poVar13 = ::std::operator<<(poVar13,
                                              "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                             );
                  poVar13 = ::std::operator<<(poVar13,":");
                  poVar13 = ::std::operator<<(poVar13,"ComputeTangentsAndBinormals");
                  poVar13 = ::std::operator<<(poVar13,"():");
                  poVar13 = (ostream *)::std::ostream::operator<<(poVar13,0x7c2);
                  ::std::operator<<(poVar13," ");
                  poVar13 = ::std::operator<<((ostream *)local_1bf0,
                                              "Invalid value in faceVertexIndices. some exceeds vertices.size()"
                                             );
                  ::std::operator<<(poVar13,"\n");
                  if (err != (string *)0x0) {
                    ::std::__cxx11::ostringstream::str();
                    ::std::__cxx11::string::operator+=((string *)err,(string *)(v1._M_elems + 1));
                    ::std::__cxx11::string::~string((string *)(v1._M_elems + 1));
                  }
                  vertices_local._7_1_ = false;
                  ::std::__cxx11::ostringstream::~ostringstream(local_1bf0);
                  goto LAB_004bec86;
                }
                pvVar21 = ::std::
                          vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::
                          operator[](vertices,(ulong)uVar11);
                v2._M_elems._4_8_ = *(undefined8 *)pvVar21->_M_elems;
                v1._M_elems[0] = pvVar21->_M_elems[2];
                pvVar21 = ::std::
                          vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::
                          operator[](vertices,(ulong)uVar12);
                v3._M_elems._4_8_ = *(undefined8 *)pvVar21->_M_elems;
                v2._M_elems[0] = pvVar21->_M_elems[2];
                pvVar21 = ::std::
                          vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::
                          operator[](vertices,(ulong)local_2164);
                _v1y = *(undefined8 *)pvVar21->_M_elems;
                v3._M_elems[0] = pvVar21->_M_elems[2];
                pvVar22 = ::std::array<float,_3UL>::operator[]
                                    ((array<float,_3UL> *)(v2._M_elems + 1),0);
                fVar38 = *pvVar22;
                pvVar22 = ::std::array<float,_3UL>::operator[]
                                    ((array<float,_3UL> *)(v2._M_elems + 1),1);
                fVar1 = *pvVar22;
                pvVar22 = ::std::array<float,_3UL>::operator[]
                                    ((array<float,_3UL> *)(v2._M_elems + 1),2);
                fVar2 = *pvVar22;
                pvVar22 = ::std::array<float,_3UL>::operator[]
                                    ((array<float,_3UL> *)(v3._M_elems + 1),0);
                fVar32 = *pvVar22;
                pvVar22 = ::std::array<float,_3UL>::operator[]
                                    ((array<float,_3UL> *)(v3._M_elems + 1),1);
                fVar3 = *pvVar22;
                pvVar22 = ::std::array<float,_3UL>::operator[]
                                    ((array<float,_3UL> *)(v3._M_elems + 1),2);
                fVar4 = *pvVar22;
                pvVar22 = ::std::array<float,_3UL>::operator[]((array<float,_3UL> *)&v1y,0);
                fVar33 = *pvVar22;
                pvVar22 = ::std::array<float,_3UL>::operator[]((array<float,_3UL> *)&v1y,1);
                fVar5 = *pvVar22;
                pvVar22 = ::std::array<float,_3UL>::operator[]((array<float,_3UL> *)&v1y,2);
                fVar6 = *pvVar22;
                sVar20 = ::std::
                         vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>::
                         size(texcoords);
                if (((sVar20 <= uVar11) ||
                    (sVar20 = ::std::
                              vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                              ::size(texcoords), sVar20 <= uVar12)) ||
                   (sVar20 = ::std::
                             vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                             ::size(texcoords), sVar20 <= local_2164)) {
                  ::std::__cxx11::ostringstream::ostringstream(local_1de8);
                  poVar13 = ::std::operator<<((ostream *)local_1de8,"[error]");
                  poVar13 = ::std::operator<<(poVar13,
                                              "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/render-data.cc"
                                             );
                  poVar13 = ::std::operator<<(poVar13,":");
                  poVar13 = ::std::operator<<(poVar13,"ComputeTangentsAndBinormals");
                  poVar13 = ::std::operator<<(poVar13,"():");
                  poVar13 = (ostream *)::std::ostream::operator<<(poVar13,0x7df);
                  ::std::operator<<(poVar13," ");
                  poVar13 = ::std::operator<<((ostream *)local_1de8,
                                              "Invalid index. some exceeds texcoords.size()");
                  ::std::operator<<(poVar13,"\n");
                  if (err != (string *)0x0) {
                    ::std::__cxx11::ostringstream::str();
                    ::std::__cxx11::string::operator+=((string *)err,(string *)&uv1);
                    ::std::__cxx11::string::~string((string *)&uv1);
                  }
                  vertices_local._7_1_ = false;
                  ::std::__cxx11::ostringstream::~ostringstream(local_1de8);
                  goto LAB_004bec86;
                }
                pvVar23 = ::std::
                          vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>::
                          operator[](texcoords,(ulong)uVar11);
                uv2._M_elems = *&pvVar23->_M_elems;
                pvVar23 = ::std::
                          vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>::
                          operator[](texcoords,(ulong)uVar12);
                uv3._M_elems = *&pvVar23->_M_elems;
                pvVar23 = ::std::
                          vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>::
                          operator[](texcoords,(ulong)local_2164);
                _x2 = *&pvVar23->_M_elems;
                pvVar24 = ::std::array<float,_2UL>::operator[](&uv2,0);
                fVar7 = *pvVar24;
                pvVar24 = ::std::array<float,_2UL>::operator[](&uv2,1);
                fVar37 = *pvVar24;
                pvVar24 = ::std::array<float,_2UL>::operator[](&uv3,0);
                fVar34 = *pvVar24;
                pvVar24 = ::std::array<float,_2UL>::operator[](&uv3,1);
                fVar36 = *pvVar24;
                pvVar24 = ::std::array<float,_2UL>::operator[]((array<float,_2UL> *)&x2,0);
                fVar35 = *pvVar24;
                pvVar24 = ::std::array<float,_2UL>::operator[]((array<float,_2UL> *)&x2,1);
                fVar32 = fVar32 - fVar38;
                fVar33 = fVar33 - fVar38;
                fVar34 = fVar34 - fVar7;
                fVar35 = fVar35 - fVar7;
                fVar36 = fVar36 - fVar37;
                fVar37 = *pvVar24 - fVar37;
                tdir._M_elems[1] = 1.0;
                if (1e-20 < ABS(fVar34 * fVar37 + -(fVar35 * fVar36))) {
                  tdir._M_elems[1] = 1.0 / (fVar34 * fVar37 + -(fVar35 * fVar36));
                }
                bdir._M_elems[1] = (fVar37 * fVar32 + -(fVar36 * fVar33)) * tdir._M_elems[1];
                bdir._M_elems[2] =
                     (fVar37 * (fVar3 - fVar1) + -(fVar36 * (fVar5 - fVar1))) * tdir._M_elems[1];
                vertex_indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
                     (fVar34 * fVar33 + -(fVar35 * fVar32)) * tdir._M_elems[1];
                bdir._M_elems[0] =
                     (fVar34 * (fVar6 - fVar2) + -(fVar35 * (fVar4 - fVar2))) * tdir._M_elems[1];
                pvVar22 = ::std::array<float,_3UL>::operator[]
                                    ((array<float,_3UL> *)(bdir._M_elems + 1),0);
                vVar8 = *pvVar22;
                pvVar18 = ::std::
                          vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                          ::operator[]((vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                                        *)local_16d0,sVar14);
                pfVar25 = tinyusdz::value::normal3f::operator[](pvVar18,0);
                *pfVar25 = vVar8;
                pvVar22 = ::std::array<float,_3UL>::operator[]
                                    ((array<float,_3UL> *)(bdir._M_elems + 1),1);
                vVar8 = *pvVar22;
                pvVar18 = ::std::
                          vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                          ::operator[]((vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                                        *)local_16d0,sVar14);
                pfVar25 = tinyusdz::value::normal3f::operator[](pvVar18,1);
                *pfVar25 = vVar8;
                pvVar22 = ::std::array<float,_3UL>::operator[]
                                    ((array<float,_3UL> *)(bdir._M_elems + 1),2);
                vVar8 = *pvVar22;
                pvVar18 = ::std::
                          vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                          ::operator[]((vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                                        *)local_16d0,sVar14);
                pfVar25 = tinyusdz::value::normal3f::operator[](pvVar18,2);
                *pfVar25 = vVar8;
                pvVar22 = ::std::array<float,_3UL>::operator[]
                                    ((array<float,_3UL> *)(bdir._M_elems + 1),0);
                vVar8 = *pvVar22;
                pvVar18 = ::std::
                          vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                          ::operator[]((vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                                        *)local_16d0,sVar15);
                pfVar25 = tinyusdz::value::normal3f::operator[](pvVar18,0);
                *pfVar25 = vVar8;
                pvVar22 = ::std::array<float,_3UL>::operator[]
                                    ((array<float,_3UL> *)(bdir._M_elems + 1),1);
                vVar8 = *pvVar22;
                pvVar18 = ::std::
                          vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                          ::operator[]((vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                                        *)local_16d0,sVar15);
                pfVar25 = tinyusdz::value::normal3f::operator[](pvVar18,1);
                *pfVar25 = vVar8;
                pvVar22 = ::std::array<float,_3UL>::operator[]
                                    ((array<float,_3UL> *)(bdir._M_elems + 1),2);
                vVar8 = *pvVar22;
                pvVar18 = ::std::
                          vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                          ::operator[]((vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                                        *)local_16d0,sVar15);
                pfVar25 = tinyusdz::value::normal3f::operator[](pvVar18,2);
                *pfVar25 = vVar8;
                pvVar22 = ::std::array<float,_3UL>::operator[]
                                    ((array<float,_3UL> *)(bdir._M_elems + 1),0);
                vVar8 = *pvVar22;
                pvVar18 = ::std::
                          vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                          ::operator[]((vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                                        *)local_16d0,__n);
                pfVar25 = tinyusdz::value::normal3f::operator[](pvVar18,0);
                *pfVar25 = vVar8;
                pvVar22 = ::std::array<float,_3UL>::operator[]
                                    ((array<float,_3UL> *)(bdir._M_elems + 1),1);
                vVar8 = *pvVar22;
                pvVar18 = ::std::
                          vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                          ::operator[]((vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                                        *)local_16d0,__n);
                pfVar25 = tinyusdz::value::normal3f::operator[](pvVar18,1);
                *pfVar25 = vVar8;
                pvVar22 = ::std::array<float,_3UL>::operator[]
                                    ((array<float,_3UL> *)(bdir._M_elems + 1),2);
                vVar8 = *pvVar22;
                pvVar18 = ::std::
                          vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                          ::operator[]((vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                                        *)local_16d0,__n);
                pfVar25 = tinyusdz::value::normal3f::operator[](pvVar18,2);
                *pfVar25 = vVar8;
                pvVar22 = ::std::array<float,_3UL>::operator[]
                                    ((array<float,_3UL> *)
                                     ((long)&vertex_indices.
                                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 4)
                                     ,0);
                vVar8 = *pvVar22;
                pvVar18 = ::std::
                          vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                          ::operator[]((vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                                        *)local_16f0,sVar14);
                pfVar25 = tinyusdz::value::normal3f::operator[](pvVar18,0);
                *pfVar25 = vVar8;
                pvVar22 = ::std::array<float,_3UL>::operator[]
                                    ((array<float,_3UL> *)
                                     ((long)&vertex_indices.
                                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 4)
                                     ,1);
                vVar8 = *pvVar22;
                pvVar18 = ::std::
                          vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                          ::operator[]((vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                                        *)local_16f0,sVar14);
                pfVar25 = tinyusdz::value::normal3f::operator[](pvVar18,1);
                *pfVar25 = vVar8;
                pvVar22 = ::std::array<float,_3UL>::operator[]
                                    ((array<float,_3UL> *)
                                     ((long)&vertex_indices.
                                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 4)
                                     ,2);
                vVar8 = *pvVar22;
                pvVar18 = ::std::
                          vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                          ::operator[]((vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                                        *)local_16f0,sVar14);
                pfVar25 = tinyusdz::value::normal3f::operator[](pvVar18,2);
                *pfVar25 = vVar8;
                pvVar22 = ::std::array<float,_3UL>::operator[]
                                    ((array<float,_3UL> *)
                                     ((long)&vertex_indices.
                                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 4)
                                     ,0);
                vVar8 = *pvVar22;
                pvVar18 = ::std::
                          vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                          ::operator[]((vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                                        *)local_16f0,sVar15);
                pfVar25 = tinyusdz::value::normal3f::operator[](pvVar18,0);
                *pfVar25 = vVar8;
                pvVar22 = ::std::array<float,_3UL>::operator[]
                                    ((array<float,_3UL> *)
                                     ((long)&vertex_indices.
                                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 4)
                                     ,1);
                vVar8 = *pvVar22;
                pvVar18 = ::std::
                          vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                          ::operator[]((vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                                        *)local_16f0,sVar15);
                pfVar25 = tinyusdz::value::normal3f::operator[](pvVar18,1);
                *pfVar25 = vVar8;
                pvVar22 = ::std::array<float,_3UL>::operator[]
                                    ((array<float,_3UL> *)
                                     ((long)&vertex_indices.
                                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 4)
                                     ,2);
                vVar8 = *pvVar22;
                pvVar18 = ::std::
                          vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                          ::operator[]((vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                                        *)local_16f0,sVar15);
                pfVar25 = tinyusdz::value::normal3f::operator[](pvVar18,2);
                *pfVar25 = vVar8;
                pvVar22 = ::std::array<float,_3UL>::operator[]
                                    ((array<float,_3UL> *)
                                     ((long)&vertex_indices.
                                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 4)
                                     ,0);
                vVar8 = *pvVar22;
                pvVar18 = ::std::
                          vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                          ::operator[]((vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                                        *)local_16f0,__n);
                pfVar25 = tinyusdz::value::normal3f::operator[](pvVar18,0);
                *pfVar25 = vVar8;
                pvVar22 = ::std::array<float,_3UL>::operator[]
                                    ((array<float,_3UL> *)
                                     ((long)&vertex_indices.
                                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 4)
                                     ,1);
                vVar8 = *pvVar22;
                pvVar18 = ::std::
                          vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                          ::operator[]((vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                                        *)local_16f0,__n);
                pfVar25 = tinyusdz::value::normal3f::operator[](pvVar18,1);
                *pfVar25 = vVar8;
                pvVar22 = ::std::array<float,_3UL>::operator[]
                                    ((array<float,_3UL> *)
                                     ((long)&vertex_indices.
                                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 4)
                                     ,2);
                vVar8 = *pvVar22;
                pvVar18 = ::std::
                          vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                          ::operator[]((vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                                        *)local_16f0,__n);
                pfVar25 = tinyusdz::value::normal3f::operator[](pvVar18,2);
                *pfVar25 = vVar8;
              }
              i = uVar17 + i;
            }
            ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       &vertex_input.uvs.
                        super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
            ComputeTangentVertexInput<tinyusdz::tydra::(anonymous_namespace)::ComputeTangentPackedVertexData>
            ::ComputeTangentVertexInput
                      ((ComputeTangentVertexInput<tinyusdz::tydra::(anonymous_namespace)::ComputeTangentPackedVertexData>
                        *)&vertex_output.uvs.
                           super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
            ComputeTangentVertexOutput<tinyusdz::tydra::(anonymous_namespace)::ComputeTangentPackedVertexData>
            ::ComputeTangentVertexOutput
                      ((ComputeTangentVertexOutput<tinyusdz::tydra::(anonymous_namespace)::ComputeTangentPackedVertexData>
                        *)&i_1);
            if (is_facevarying_input) {
              for (i_2 = 0; sVar14 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                                     size(faceVertexIndices), i_2 < sVar14; i_2 = i_2 + 1) {
                pvVar19 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                    (faceVertexIndices,i_2);
                ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                           &vertex_output.uvs.
                            super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,pvVar19);
              }
              ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::
              operator=((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_> *)
                        &vertex_input.point_indices.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,normals);
              ::std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>::
              operator=((vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_> *)
                        &vertex_input.normals.
                         super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,texcoords);
            }
            else {
              for (vertex_point_indices.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  puVar9 = vertex_point_indices.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,
                  puVar26 = (pointer)::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
                                     size(faceVertexIndices), puVar9 < puVar26;
                  vertex_point_indices.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage =
                       (pointer)((long)vertex_point_indices.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 1)) {
                pvVar19 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                    (faceVertexIndices,
                                     (size_type)
                                     vertex_point_indices.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
                ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                           &vertex_output.uvs.
                            super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,pvVar19);
                pvVar19 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                    (faceVertexIndices,
                                     (size_type)
                                     vertex_point_indices.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
                pvVar21 = ::std::
                          vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::
                          operator[](normals,(ulong)*pvVar19);
                ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::
                push_back((vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                           *)&vertex_input.point_indices.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,pvVar21);
                pvVar19 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                    (faceVertexIndices,
                                     (size_type)
                                     vertex_point_indices.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
                pvVar23 = ::std::
                          vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>::
                          operator[](texcoords,(ulong)*pvVar19);
                ::std::vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>::
                push_back((vector<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                           *)&vertex_input.normals.
                              super__Vector_base<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,pvVar23);
              }
            }
            ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1f38);
            BuildIndices<tinyusdz::tydra::(anonymous_namespace)::ComputeTangentVertexInput<tinyusdz::tydra::(anonymous_namespace)::ComputeTangentPackedVertexData>,tinyusdz::tydra::(anonymous_namespace)::ComputeTangentVertexOutput<tinyusdz::tydra::(anonymous_namespace)::ComputeTangentPackedVertexData>,tinyusdz::tydra::(anonymous_namespace)::ComputeTangentPackedVertexData,tinyusdz::tydra::(anonymous_namespace)::ComputeTangentPackedVertexDataHasher,tinyusdz::tydra::(anonymous_namespace)::ComputeTangentPackedVertexDataEqual>
                      ((ComputeTangentVertexInput<tinyusdz::tydra::(anonymous_namespace)::ComputeTangentPackedVertexData>
                        *)&vertex_output.uvs.
                           super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                       (ComputeTangentVertexOutput<tinyusdz::tydra::(anonymous_namespace)::ComputeTangentPackedVertexData>
                        *)&i_1,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                               &vertex_input.uvs.
                                super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                       (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1f38);
            ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1f38);
            ComputeTangentVertexOutput<tinyusdz::tydra::(anonymous_namespace)::ComputeTangentPackedVertexData>
            ::~ComputeTangentVertexOutput
                      ((ComputeTangentVertexOutput<tinyusdz::tydra::(anonymous_namespace)::ComputeTangentPackedVertexData>
                        *)&i_1);
            ComputeTangentVertexInput<tinyusdz::tydra::(anonymous_namespace)::ComputeTangentPackedVertexData>
            ::~ComputeTangentVertexInput
                      ((ComputeTangentVertexInput<tinyusdz::tydra::(anonymous_namespace)::ComputeTangentPackedVertexData>
                        *)&vertex_output.uvs.
                           super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
            __first_00 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                                   ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                    &vertex_input.uvs.
                                     super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
            v_tn.
            super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 (pointer)::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                     &vertex_input.uvs.
                                      super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
            local_1f48 = ::std::
                         max_element<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                                   (__first_00._M_current,
                                    (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                     )v_tn.
                                      super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
            puVar27 = __gnu_cxx::
                      __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                      ::operator*(&local_1f48);
            local_1f3c = *puVar27;
            ::std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>::
            vector((vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_> *)
                   local_1f70);
            v_bn.
            super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
            ::std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>::
            assign((vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_> *)
                   local_1f70,(ulong)local_1f3c,
                   (value_type *)
                   ((long)&v_bn.
                           super__Vector_base<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
            ::std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>::
            vector((vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_> *)
                   local_1f98);
            i_3._4_4_ = 0;
            local_1fa0 = 0;
            local_1f9c = 0;
            ::std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>::
            assign((vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_> *)
                   local_1f98,(ulong)local_1f3c,(value_type *)((long)&i_3 + 4));
            Tn.y = 0.0;
            Tn.z = 0.0;
            for (; sVar14 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                       &vertex_input.uvs.
                                        super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage),
                (ulong)Tn._4_8_ < sVar14; Tn._4_8_ = Tn._4_8_ + 1) {
              pvVar28 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                   &vertex_input.uvs.
                                    super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,Tn._4_8_);
              pvVar18 = ::std::
                        vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                        ::operator[]((vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                                      *)local_16d0,(ulong)*pvVar28);
              Bn.y = pvVar18->x;
              Bn.z = pvVar18->y;
              pvVar28 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                   &vertex_input.uvs.
                                    super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,Tn._4_8_);
              pvVar18 = ::std::
                        vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                        ::operator[]((vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                                      *)local_16f0,(ulong)*pvVar28);
              i_4._0_4_ = pvVar18->x;
              i_4._4_4_ = pvVar18->y;
              Bn.x = pvVar18->z;
              pfVar25 = tinyusdz::value::normal3f::operator[]((normal3f *)&Bn.y,0);
              fVar38 = *pfVar25;
              pvVar28 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                   &vertex_input.uvs.
                                    super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,Tn._4_8_);
              pvVar18 = ::std::
                        vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                        ::operator[]((vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                                      *)local_1f70,(ulong)*pvVar28);
              pfVar25 = tinyusdz::value::normal3f::operator[](pvVar18,0);
              *pfVar25 = fVar38 + *pfVar25;
              pfVar25 = tinyusdz::value::normal3f::operator[]((normal3f *)&Bn.y,1);
              fVar38 = *pfVar25;
              pvVar28 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                   &vertex_input.uvs.
                                    super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,Tn._4_8_);
              pvVar18 = ::std::
                        vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                        ::operator[]((vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                                      *)local_1f70,(ulong)*pvVar28);
              pfVar25 = tinyusdz::value::normal3f::operator[](pvVar18,1);
              *pfVar25 = fVar38 + *pfVar25;
              pfVar25 = tinyusdz::value::normal3f::operator[]((normal3f *)&Bn.y,2);
              fVar38 = *pfVar25;
              pvVar28 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                   &vertex_input.uvs.
                                    super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,Tn._4_8_);
              pvVar18 = ::std::
                        vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                        ::operator[]((vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                                      *)local_1f70,(ulong)*pvVar28);
              pfVar25 = tinyusdz::value::normal3f::operator[](pvVar18,2);
              *pfVar25 = fVar38 + *pfVar25;
              pfVar25 = tinyusdz::value::normal3f::operator[]((normal3f *)&i_4,0);
              fVar38 = *pfVar25;
              pvVar28 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                   &vertex_input.uvs.
                                    super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,Tn._4_8_);
              pvVar18 = ::std::
                        vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                        ::operator[]((vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                                      *)local_1f98,(ulong)*pvVar28);
              pfVar25 = tinyusdz::value::normal3f::operator[](pvVar18,0);
              *pfVar25 = fVar38 + *pfVar25;
              pfVar25 = tinyusdz::value::normal3f::operator[]((normal3f *)&i_4,1);
              fVar38 = *pfVar25;
              pvVar28 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                   &vertex_input.uvs.
                                    super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,Tn._4_8_);
              pvVar18 = ::std::
                        vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                        ::operator[]((vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                                      *)local_1f98,(ulong)*pvVar28);
              pfVar25 = tinyusdz::value::normal3f::operator[](pvVar18,1);
              *pfVar25 = fVar38 + *pfVar25;
              pfVar25 = tinyusdz::value::normal3f::operator[]((normal3f *)&i_4,2);
              fVar38 = *pfVar25;
              pvVar28 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                   &vertex_input.uvs.
                                    super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,Tn._4_8_);
              pvVar18 = ::std::
                        vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                        ::operator[]((vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                                      *)local_1f98,(ulong)*pvVar28);
              pfVar25 = tinyusdz::value::normal3f::operator[](pvVar18,2);
              *pfVar25 = fVar38 + *pfVar25;
            }
            for (local_1fd0 = 0; local_1fd0 < local_1f3c; local_1fd0 = local_1fd0 + 1) {
              pvVar18 = ::std::
                        vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                        ::operator[]((vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                                      *)local_1f70,local_1fd0);
              fVar38 = vlength(pvVar18);
              if (0.0 < fVar38) {
                pvVar18 = ::std::
                          vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                          ::operator[]((vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                                        *)local_1f70,local_1fd0);
                nVar39 = vnormalize(pvVar18,1.1920929e-07);
                local_1ff0._0_8_ = nVar39._0_8_;
                local_1fdc._0_4_ = local_1ff0.x;
                local_1fdc._4_4_ = local_1ff0.y;
                local_1ff0.z = nVar39.z;
                local_1fd4 = local_1ff0.z;
                local_1ff0 = nVar39;
                pvVar18 = ::std::
                          vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                          ::operator[]((vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                                        *)local_1f70,local_1fd0);
                pvVar18->x = (float)(undefined4)local_1fdc;
                pvVar18->y = (float)local_1fdc._4_4_;
                pvVar18->z = local_1fd4;
              }
              pvVar18 = ::std::
                        vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                        ::operator[]((vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                                      *)local_1f98,local_1fd0);
              fVar38 = vlength(pvVar18);
              if (0.0 < fVar38) {
                pvVar18 = ::std::
                          vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                          ::operator[]((vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                                        *)local_1f98,local_1fd0);
                nVar39 = vnormalize(pvVar18,1.1920929e-07);
                local_2010._0_8_ = nVar39._0_8_;
                local_1ffc._0_4_ = local_2010.x;
                local_1ffc._4_4_ = local_2010.y;
                local_2010.z = nVar39.z;
                local_1ff4 = local_2010.z;
                local_2010 = nVar39;
                pvVar18 = ::std::
                          vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                          ::operator[]((vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                                        *)local_1f98,local_1fd0);
                pvVar18->x = (float)(undefined4)local_1ffc;
                pvVar18->y = (float)local_1ffc._4_4_;
                pvVar18->z = local_1ff4;
              }
            }
            local_201c._M_elems[0] = 0.0;
            local_201c._M_elems[1] = 0.0;
            local_201c._M_elems[2] = 0.0;
            ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::assign
                      (tangents,(ulong)local_1f3c,&local_201c);
            i_5._0_4_ = 0;
            i_5._4_4_ = 0;
            local_2020 = 0.0;
            ::std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::assign
                      (binormals,(ulong)local_1f3c,(value_type *)&i_5);
            n.y = 0.0;
            n.z = 0.0;
            for (; sVar14 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                       &vertex_input.uvs.
                                        super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage),
                (ulong)n._4_8_ < sVar14; n._4_8_ = n._4_8_ + 1) {
              this = &vertex_input.uvs.
                      super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
              pvVar28 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this,
                                   n._4_8_);
              pvVar21 = ::std::
                        vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::
                        operator[](normals,(ulong)*pvVar28);
              pvVar29 = ::std::array<float,_3UL>::operator[](pvVar21,0);
              vVar8 = *pvVar29;
              pfVar25 = &Tn_1.y;
              pfVar30 = tinyusdz::value::normal3f::operator[]((normal3f *)pfVar25,0);
              *pfVar30 = vVar8;
              pvVar28 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this,
                                   n._4_8_);
              pvVar21 = ::std::
                        vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::
                        operator[](normals,(ulong)*pvVar28);
              pvVar29 = ::std::array<float,_3UL>::operator[](pvVar21,1);
              vVar8 = *pvVar29;
              pfVar30 = tinyusdz::value::normal3f::operator[]((normal3f *)pfVar25,1);
              *pfVar30 = vVar8;
              pvVar28 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this,
                                   n._4_8_);
              pvVar21 = ::std::
                        vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::
                        operator[](normals,(ulong)*pvVar28);
              pvVar29 = ::std::array<float,_3UL>::operator[](pvVar21,2);
              vVar8 = *pvVar29;
              pfVar30 = tinyusdz::value::normal3f::operator[]((normal3f *)pfVar25,2);
              *pfVar30 = vVar8;
              pvVar28 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this,
                                   n._4_8_);
              pvVar18 = ::std::
                        vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                        ::operator[]((vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                                      *)local_1f70,(ulong)*pvVar28);
              Tn_1.x = pvVar18->z;
              Bn_1.z = pvVar18->x;
              uStack_2044 = pvVar18->y;
              pvVar28 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this,
                                   n._4_8_);
              pvVar18 = ::std::
                        vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                        ::operator[]((vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>
                                      *)local_1f98,(ulong)*pvVar28);
              Bn_1.x = pvVar18->z;
              local_2058._0_4_ = pvVar18->x;
              local_2058._4_4_ = pvVar18->y;
              fVar38 = vdot((normal3f *)pfVar25,(normal3f *)&Bn_1.z);
              nVar39 = tinyusdz::operator*((normal3f *)pfVar25,fVar38);
              local_2080.z = nVar39.z;
              local_2070.z = local_2080.z;
              local_2080._0_8_ = nVar39._0_8_;
              local_2070.x = local_2080.x;
              local_2070.y = local_2080.y;
              local_2080 = nVar39;
              nVar39 = tinyusdz::operator-((normal3f *)&Bn_1.z,&local_2070);
              local_2090._0_8_ = nVar39._0_8_;
              local_2064._0_4_ = local_2090.x;
              local_2064._4_4_ = local_2090.y;
              local_2090.z = nVar39.z;
              local_205c = local_2090.z;
              Bn_1.z = local_2090.x;
              uStack_2044 = local_2090.y;
              Tn_1.x = local_2090.z;
              local_2090 = nVar39;
              fVar38 = vlength((normal3f *)&Bn_1.z);
              if (0.0 < fVar38) {
                nVar39 = vnormalize((normal3f *)&Bn_1.z,1.1920929e-07);
                local_20b0._0_8_ = nVar39._0_8_;
                local_209c._0_4_ = local_20b0.x;
                local_209c._4_4_ = local_20b0.y;
                local_20b0.z = nVar39.z;
                local_2094 = local_20b0.z;
                Bn_1.z = local_20b0.x;
                uStack_2044 = local_20b0.y;
                Tn_1.x = local_20b0.z;
                local_20b0 = nVar39;
              }
              nVar39 = vcross((normal3f *)&Tn_1.y,(normal3f *)&Bn_1.z);
              local_20d0._0_8_ = nVar39._0_8_;
              local_20bc.x = local_20d0.x;
              local_20bc.y = local_20d0.y;
              local_20d0.z = nVar39.z;
              local_20bc.z = local_20d0.z;
              fVar38 = vdot(&local_20bc,(normal3f *)local_2058);
              if (fVar38 < 0.0) {
                nVar39 = tinyusdz::operator*((normal3f *)&Bn_1.z,-1.0);
                local_20f0 = nVar39._0_8_;
                local_20e8 = nVar39.z;
                stack0xffffffffffffdfb8 = local_20f0;
                Tn_1.x = local_20e8;
              }
              pfVar25 = tinyusdz::value::normal3f::operator[]((normal3f *)&Bn_1.z,0);
              fVar38 = *pfVar25;
              pvVar28 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                   &vertex_input.uvs.
                                    super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,n._4_8_);
              pvVar31 = ::std::
                        vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::
                        operator[](tangents,(ulong)*pvVar28);
              pvVar22 = ::std::array<float,_3UL>::operator[](pvVar31,0);
              *pvVar22 = fVar38;
              pfVar25 = tinyusdz::value::normal3f::operator[]((normal3f *)&Bn_1.z,1);
              fVar38 = *pfVar25;
              pvVar28 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                   &vertex_input.uvs.
                                    super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,n._4_8_);
              pvVar31 = ::std::
                        vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::
                        operator[](tangents,(ulong)*pvVar28);
              pvVar22 = ::std::array<float,_3UL>::operator[](pvVar31,1);
              *pvVar22 = fVar38;
              pfVar25 = tinyusdz::value::normal3f::operator[]((normal3f *)&Bn_1.z,2);
              fVar38 = *pfVar25;
              pvVar28 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                   &vertex_input.uvs.
                                    super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,n._4_8_);
              pvVar31 = ::std::
                        vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::
                        operator[](tangents,(ulong)*pvVar28);
              pvVar22 = ::std::array<float,_3UL>::operator[](pvVar31,2);
              *pvVar22 = fVar38;
              pfVar25 = tinyusdz::value::normal3f::operator[]((normal3f *)local_2058,0);
              fVar38 = *pfVar25;
              pvVar28 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                   &vertex_input.uvs.
                                    super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,n._4_8_);
              pvVar31 = ::std::
                        vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::
                        operator[](binormals,(ulong)*pvVar28);
              pvVar22 = ::std::array<float,_3UL>::operator[](pvVar31,0);
              *pvVar22 = fVar38;
              pfVar25 = tinyusdz::value::normal3f::operator[]((normal3f *)local_2058,1);
              fVar38 = *pfVar25;
              pvVar28 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                   &vertex_input.uvs.
                                    super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,n._4_8_);
              pvVar31 = ::std::
                        vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::
                        operator[](binormals,(ulong)*pvVar28);
              pvVar22 = ::std::array<float,_3UL>::operator[](pvVar31,1);
              *pvVar22 = fVar38;
              pfVar25 = tinyusdz::value::normal3f::operator[]((normal3f *)local_2058,2);
              fVar38 = *pfVar25;
              pvVar28 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                   &vertex_input.uvs.
                                    super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,n._4_8_);
              pvVar31 = ::std::
                        vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>::
                        operator[](binormals,(ulong)*pvVar28);
              pvVar22 = ::std::array<float,_3UL>::operator[](pvVar31,2);
              *pvVar22 = fVar38;
            }
            ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                      (out_vertex_indices,
                       (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       &vertex_input.uvs.
                        super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
            vertices_local._7_1_ = true;
            ::std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>::
            ~vector((vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_> *
                    )local_1f98);
            ::std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>::
            ~vector((vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_> *
                    )local_1f70);
            ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       &vertex_input.uvs.
                        super__Vector_base<std::array<float,_2UL>,_std::allocator<std::array<float,_2UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
LAB_004bec86:
            ::std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>::
            ~vector((vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_> *
                    )local_16f0);
            ::std::vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_>::
            ~vector((vector<tinyusdz::value::normal3f,_std::allocator<tinyusdz::value::normal3f>_> *
                    )local_16d0);
          }
        }
      }
    }
  }
  return vertices_local._7_1_;
}

Assistant:

static bool ComputeTangentsAndBinormals(
    const std::vector<vec3> &vertices,
    const std::vector<uint32_t> &faceVertexCounts,
    const std::vector<uint32_t> &faceVertexIndices,
    const std::vector<vec2> &texcoords, const std::vector<vec3> &normals,
    bool is_facevarying_input,  // false: 'vertex' varying
    std::vector<vec3> *tangents, std::vector<vec3> *binormals,
    std::vector<uint32_t> *out_vertex_indices, std::string *err) {
  if (!tangents) {
    PUSH_ERROR_AND_RETURN("tangents arg is nullptr.");
  }

  if (!binormals) {
    PUSH_ERROR_AND_RETURN("binormals arg is nullptr.");
  }

  if (!out_vertex_indices) {
    PUSH_ERROR_AND_RETURN("out_indices arg is nullptr.");
  }

  if (vertices.empty()) {
    PUSH_ERROR_AND_RETURN("vertices is empty.");
  }

  // At least 1 triangle face should exist.
  if (faceVertexIndices.size() < 3) {
    PUSH_ERROR_AND_RETURN("faceVertexIndices.size < 3");
  }

  if (texcoords.empty()) {
    PUSH_ERROR_AND_RETURN("texcoords is empty");
  }

  if (normals.empty()) {
    PUSH_ERROR_AND_RETURN("normals is empty");
  }

  if (is_facevarying_input) {
    if (vertices.size() != faceVertexIndices.size()) {
      PUSH_ERROR_AND_RETURN("Invalid vertices.size.");
    }
    if (texcoords.size() != faceVertexIndices.size()) {
      PUSH_ERROR_AND_RETURN("Invalid texcoords.size.");
    }
    if (normals.size() != faceVertexIndices.size()) {
      PUSH_ERROR_AND_RETURN("Invalid normals.size.");
    }
  } else {
    uint32_t max_vert_index =
        *std::max_element(faceVertexIndices.begin(), faceVertexIndices.end());
    if (max_vert_index >= vertices.size()) {
      PUSH_ERROR_AND_RETURN("Invalid vertices.size.");
    }
    if (max_vert_index >= texcoords.size()) {
      PUSH_ERROR_AND_RETURN("Invalid texcoords.size.");
    }
    if (max_vert_index >= normals.size()) {
      PUSH_ERROR_AND_RETURN("Invalid normals.size.");
    }
  }

  bool hasFaceVertexCounts = true;
  if (faceVertexCounts.size() == 0) {
    // Assume all triangle faces.
    if ((faceVertexIndices.size() % 3) != 0) {
      PUSH_ERROR_AND_RETURN(
          "Invalid faceVertexIndices. It must be all triangles: "
          "faceVertexIndices.size % 3 == 0");
    }
    hasFaceVertexCounts = false;
  }

  // tn, bn = facevarying
  std::vector<value::normal3f> tn(faceVertexIndices.size());
  memset(&tn.at(0), 0, sizeof(value::normal3f) * tn.size());
  std::vector<value::normal3f> bn(faceVertexIndices.size());
  memset(&bn.at(0), 0, sizeof(value::normal3f) * bn.size());

  //
  // 1. Compute facevarying tangent/binormal for each faceVertex.
  //
  size_t faceVertexIndexOffset{0};
  for (size_t i = 0; i < faceVertexCounts.size(); i++) {
    size_t nv = hasFaceVertexCounts ? faceVertexCounts[i] : 3;

    if ((faceVertexIndexOffset + nv) >= faceVertexIndices.size()) {
      // Invalid faceVertexIndices
      PUSH_ERROR_AND_RETURN("Invalid value in faceVertexOffset.");
    }

    if (nv < 3) {
      PUSH_ERROR_AND_RETURN("Degenerated facet found.");
    }

    // Process each two-edges per facet.
    //
    // Example:
    //
    // fv3
    //  o----------------o fv2
    //   \              /
    //    \            /
    //     o----------o
    //    fv0         fv1

    // facet0:  fv0, fv1, fv2
    // facet1:  fv1, fv2, fv3

    for (size_t f = 0; f < nv - 2; f++) {
      size_t fid0 = faceVertexIndexOffset + f;
      size_t fid1 = faceVertexIndexOffset + f + 1;
      size_t fid2 = faceVertexIndexOffset + f + 2;

      uint32_t vf0 =
          is_facevarying_input ? uint32_t(fid0) : faceVertexIndices[fid0];
      uint32_t vf1 =
          is_facevarying_input ? uint32_t(fid1) : faceVertexIndices[fid1];
      uint32_t vf2 =
          is_facevarying_input ? uint32_t(fid2) : faceVertexIndices[fid2];

      if ((vf0 >= vertices.size()) || (vf1 >= vertices.size()) ||
          (vf2 >= vertices.size())) {
        // index out-of-range
        PUSH_ERROR_AND_RETURN(
            "Invalid value in faceVertexIndices. some exceeds vertices.size()");
      }

      vec3 v1 = vertices[vf0];
      vec3 v2 = vertices[vf1];
      vec3 v3 = vertices[vf2];

      float v1x = v1[0];
      float v1y = v1[1];
      float v1z = v1[2];

      float v2x = v2[0];
      float v2y = v2[1];
      float v2z = v2[2];

      float v3x = v3[0];
      float v3y = v3[1];
      float v3z = v3[2];

      float w1x = 0.0f;
      float w1y = 0.0f;
      float w2x = 0.0f;
      float w2y = 0.0f;
      float w3x = 0.0f;
      float w3y = 0.0f;

      if ((vf0 >= texcoords.size()) || (vf1 >= texcoords.size()) ||
          (vf2 >= texcoords.size())) {
        // index out-of-range
        PUSH_ERROR_AND_RETURN("Invalid index. some exceeds texcoords.size()");
      }

      {
        vec2 uv1 = texcoords[vf0];
        vec2 uv2 = texcoords[vf1];
        vec2 uv3 = texcoords[vf2];

        w1x = uv1[0];
        w1y = uv1[1];
        w2x = uv2[0];
        w2y = uv2[1];
        w3x = uv3[0];
        w3y = uv3[1];
      }

      float x1 = v2x - v1x;
      float x2 = v3x - v1x;
      float y1 = v2y - v1y;
      float y2 = v3y - v1y;
      float z1 = v2z - v1z;
      float z2 = v3z - v1z;

      float s1 = w2x - w1x;
      float s2 = w3x - w1x;
      float t1 = w2y - w1y;
      float t2 = w3y - w1y;

      float r = 1.0;

      if (std::fabs(double(s1 * t2 - s2 * t1)) > 1.0e-20) {
        r /= (s1 * t2 - s2 * t1);
      }

      vec3 tdir{(t2 * x1 - t1 * x2) * r, (t2 * y1 - t1 * y2) * r,
                (t2 * z1 - t1 * z2) * r};
      vec3 bdir{(s1 * x2 - s2 * x1) * r, (s1 * y2 - s2 * y1) * r,
                (s1 * z2 - s2 * z1) * r};

      //
      // NOTE: for quad or polygon mesh, this overwrites previous 2 facevarying
      // points for each face.
      //       And this would not be a good way to compute tangents for
      //       quad/polygon.
      //

      tn[fid0][0] = tdir[0];
      tn[fid0][1] = tdir[1];
      tn[fid0][2] = tdir[2];

      tn[fid1][0] = tdir[0];
      tn[fid1][1] = tdir[1];
      tn[fid1][2] = tdir[2];

      tn[fid2][0] = tdir[0];
      tn[fid2][1] = tdir[1];
      tn[fid2][2] = tdir[2];

      bn[fid0][0] = bdir[0];
      bn[fid0][1] = bdir[1];
      bn[fid0][2] = bdir[2];

      bn[fid1][0] = bdir[0];
      bn[fid1][1] = bdir[1];
      bn[fid1][2] = bdir[2];

      bn[fid2][0] = bdir[0];
      bn[fid2][1] = bdir[1];
      bn[fid2][2] = bdir[2];
    }

    faceVertexIndexOffset += nv;
  }

  //
  // 2. Build indices(use same index for shared-vertex)
  //
  std::vector<uint32_t> vertex_indices;  // len = faceVertexIndices.size()
  {
    ComputeTangentVertexInput<ComputeTangentPackedVertexData> vertex_input;
    ComputeTangentVertexOutput<ComputeTangentPackedVertexData> vertex_output;

    if (is_facevarying_input) {
      // input position is still in 'vertex' variability.
      for (size_t i = 0; i < faceVertexIndices.size(); i++) {
        vertex_input.point_indices.push_back(faceVertexIndices[i]);
      }
      vertex_input.normals = normals;
      vertex_input.uvs = texcoords;
    } else {
      // expand to facevarying.
      for (size_t i = 0; i < faceVertexIndices.size(); i++) {
        vertex_input.point_indices.push_back(faceVertexIndices[i]);
        vertex_input.normals.push_back(normals[faceVertexIndices[i]]);
        vertex_input.uvs.push_back(texcoords[faceVertexIndices[i]]);
      }
    }

    std::vector<uint32_t> vertex_point_indices;

    BuildIndices<ComputeTangentVertexInput<ComputeTangentPackedVertexData>,
                 ComputeTangentVertexOutput<ComputeTangentPackedVertexData>,
                 ComputeTangentPackedVertexData,
                 ComputeTangentPackedVertexDataHasher,
                 ComputeTangentPackedVertexDataEqual>(
        vertex_input, vertex_output, vertex_indices, vertex_point_indices);

    DCOUT("faceVertexIndices.size : " << faceVertexIndices.size());
    DCOUT("# of indices after the build: "
          << vertex_indices.size() << ", reduced "
          << (faceVertexIndices.size() - vertex_indices.size()) << " indices.");
    // We only need indices. Discard vertex_output and vertrex_point_indices
  }

  const uint32_t num_verts =
      *std::max_element(vertex_indices.begin(), vertex_indices.end());

  //
  // 3. normalize * orthogonalize;
  //

  // per-vertex tangents/binormals
  std::vector<value::normal3f> v_tn;
  v_tn.assign(num_verts, {0.0f, 0.0f, 0.0f});

  std::vector<value::normal3f> v_bn;
  v_bn.assign(num_verts, {0.0f, 0.0f, 0.0f});

  for (size_t i = 0; i < vertex_indices.size(); i++) {
    value::normal3f Tn = tn[vertex_indices[i]];
    value::normal3f Bn = bn[vertex_indices[i]];

    v_tn[vertex_indices[i]][0] += Tn[0];
    v_tn[vertex_indices[i]][1] += Tn[1];
    v_tn[vertex_indices[i]][2] += Tn[2];

    v_bn[vertex_indices[i]][0] += Bn[0];
    v_bn[vertex_indices[i]][1] += Bn[1];
    v_bn[vertex_indices[i]][2] += Bn[2];
  }

  for (size_t i = 0; i < size_t(num_verts); i++) {
    if (vlength(v_tn[i]) > 0.0f) {
      v_tn[i] = vnormalize(v_tn[i]);
    }
    if (vlength(v_bn[i]) > 0.0f) {
      v_bn[i] = vnormalize(v_bn[i]);
    }
  }

  tangents->assign(num_verts, {0.0f, 0.0f, 0.0f});
  binormals->assign(num_verts, {0.0f, 0.0f, 0.0f});

  for (size_t i = 0; i < vertex_indices.size(); i++) {
    value::normal3f n;

    // http://www.terathon.com/code/tangent.html

    n[0] = normals[vertex_indices[i]][0];
    n[1] = normals[vertex_indices[i]][1];
    n[2] = normals[vertex_indices[i]][2];

    value::normal3f Tn = v_tn[vertex_indices[i]];
    value::normal3f Bn = v_bn[vertex_indices[i]];

    // Gram-Schmidt orthogonalize
    Tn = (Tn - n * vdot(n, Tn));
    if (vlength(Tn) > 0.0f) {
      Tn = vnormalize(Tn);
    }

    // Calculate handedness
    if (vdot(vcross(n, Tn), Bn) < 0.0f) {
      Tn = Tn * -1.0f;
    }

    ((*tangents)[vertex_indices[i]])[0] = Tn[0];
    ((*tangents)[vertex_indices[i]])[1] = Tn[1];
    ((*tangents)[vertex_indices[i]])[2] = Tn[2];

    ((*binormals)[vertex_indices[i]])[0] = Bn[0];
    ((*binormals)[vertex_indices[i]])[1] = Bn[1];
    ((*binormals)[vertex_indices[i]])[2] = Bn[2];
  }

  (*out_vertex_indices) = vertex_indices;

  return true;
}